

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O1

bool __thiscall rw::Texture::streamWrite(Texture *this,Stream *stream)

{
  uint32 size;
  size_t sVar1;
  uint uVar2;
  char buf [36];
  char local_58 [48];
  
  size = streamGetSize(this);
  writeChunkHeader(stream,6,size);
  writeChunkHeader(stream,1,4);
  uVar2 = this->filterAddressing;
  if (this->raster != (Raster *)0x0) {
    uVar2 = uVar2 | (~this->raster->format & 0x1000U) << 4;
  }
  Stream::writeU32(stream,uVar2);
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_58[0x20] = '\0';
  local_58[0x21] = '\0';
  local_58[0x22] = '\0';
  local_58[0x23] = '\0';
  strncpy(local_58,this->name,0x20);
  sVar1 = strlen(local_58);
  uVar2 = ((uint)sVar1 & 0xfffffffc) + 4;
  writeChunkHeader(stream,2,uVar2);
  (*stream->_vptr_Stream[3])(stream,local_58,(ulong)uVar2);
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_58[0x20] = '\0';
  local_58[0x21] = '\0';
  local_58[0x22] = '\0';
  local_58[0x23] = '\0';
  strncpy(local_58,this->mask,0x20);
  sVar1 = strlen(local_58);
  uVar2 = ((uint)sVar1 & 0xfffffffc) + 4;
  writeChunkHeader(stream,2,uVar2);
  (*stream->_vptr_Stream[3])(stream,local_58,(ulong)uVar2);
  PluginList::streamWrite((PluginList *)&s_plglist,stream,this);
  return true;
}

Assistant:

bool
Texture::streamWrite(Stream *stream)
{
	int size;
	char buf[36];
	writeChunkHeader(stream, ID_TEXTURE, this->streamGetSize());
	writeChunkHeader(stream, ID_STRUCT, 4);
	uint32 filterAddressing = this->filterAddressing;
	if(this->raster && (raster->format & Raster::AUTOMIPMAP) == 0)
		filterAddressing |= 0x10000;
	stream->writeU32(filterAddressing);

	memset(buf, 0, 36);
	strncpy(buf, this->name, 32);
	size = strlen(buf)+4 & ~3;
	writeChunkHeader(stream, ID_STRING, size);
	stream->write8(buf, size);

	memset(buf, 0, 36);
	strncpy(buf, this->mask, 32);
	size = strlen(buf)+4 & ~3;
	writeChunkHeader(stream, ID_STRING, size);
	stream->write8(buf, size);

	s_plglist.streamWrite(stream, this);
	return true;
}